

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall
cmake::SetArgs(cmake *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  pointer pbVar5;
  long lVar6;
  cmGlobalGenerator *gg;
  undefined8 uVar7;
  string *psVar8;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 collapse;
  uint uVar9;
  ulong uVar10;
  string value;
  string kdevError;
  string local_f8;
  undefined1 local_d8 [16];
  element_type local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5)) {
    local_c8.field_0.Context.FilePath._M_dataplus._M_p = (_Alloc_hider)&this->GeneratorToolset;
    local_c8.field_0.Context.FilePath._M_string_length = (size_type)&this->GeneratorPlatform;
    local_c8.field_0._48_8_ = &this->TraceOnlyThisSources;
    local_c8.field_0._56_8_ = &this->GraphVizFile;
    local_c8.field_0.Context.Line = (long)&this->CheckStampList;
    local_c8.Parent.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)&this->CheckStampFile;
    local_c8.Parent.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->CheckBuildSystemArgument;
    uVar10 = 1;
    local_c8.field_0.Bottom.Position.Position = 0;
    local_c8.field_0._24_8_ = 0;
    do {
      pbVar5 = pbVar5 + uVar10;
      lVar6 = std::__cxx11::string::find((char *)pbVar5,0x47fb59,0);
      uVar9 = (uint)uVar10;
      if ((lVar6 == 0) ||
         (lVar6 = std::__cxx11::string::find((char *)pbVar5,0x4836bb,0), lVar6 == 0)) {
        std::__cxx11::string::substr((ulong)&local_f8,(ulong)pbVar5);
        if ((local_f8._M_string_length == 0) &&
           ((uVar9 = uVar9 + 1,
            (ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar9 ||
            (std::__cxx11::string::_M_assign((string *)&local_f8), *local_f8._M_dataplus._M_p == '-'
            )))) {
          bVar3 = false;
          cmSystemTools::Error
                    ("No source directory specified for -S",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
          cmsys::SystemTools::CollapseFullPath((string *)local_d8,&local_f8);
          std::__cxx11::string::operator=((string *)&local_f8,(string *)local_d8);
          if ((element_type *)local_d8._0_8_ != &local_c8) {
            operator_delete((void *)local_d8._0_8_,
                            CONCAT71(local_c8.field_0._1_7_,local_c8.field_0._0_1_) + 1);
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_f8);
          bVar3 = true;
          SetHomeDirectory(this,&local_f8);
        }
        goto LAB_00163c30;
      }
      lVar6 = std::__cxx11::string::find((char *)pbVar5,0x4836be,0);
      if (lVar6 == 0) goto LAB_00163c54;
      lVar6 = std::__cxx11::string::find((char *)pbVar5,0x4836e2,0);
      if (lVar6 == 0) {
        std::__cxx11::string::substr((ulong)&local_f8,(ulong)pbVar5);
        if ((local_f8._M_string_length == 0) &&
           ((uVar9 = uVar9 + 1,
            (ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar9 ||
            (std::__cxx11::string::_M_assign((string *)&local_f8), *local_f8._M_dataplus._M_p == '-'
            )))) {
          bVar3 = false;
          cmSystemTools::Error
                    ("No build directory specified for -B",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
          cmsys::SystemTools::CollapseFullPath((string *)local_d8,&local_f8);
          std::__cxx11::string::operator=((string *)&local_f8,(string *)local_d8);
          if ((element_type *)local_d8._0_8_ != &local_c8) {
            operator_delete((void *)local_d8._0_8_,
                            CONCAT71(local_c8.field_0._1_7_,local_c8.field_0._0_1_) + 1);
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_f8);
          bVar3 = true;
          SetHomeOutputDirectory(this,&local_f8);
        }
        goto LAB_00163c30;
      }
      if ((uVar10 < ((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5) - 2U) &&
         (lVar6 = std::__cxx11::string::find((char *)pbVar5,0x4836e5,0), lVar6 == 0)) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   local_c8.Parent.
                   super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        uVar9 = uVar9 + 2;
        iVar4 = atoi((args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
        this->ClearBuildSystem = 0 < iVar4;
LAB_00163c54:
        bVar3 = true;
      }
      else {
        if (((uVar10 < ((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) &&
            (lVar6 = std::__cxx11::string::find((char *)pbVar5,0x4836fa,0),
            uVar7 = local_c8.Parent.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr, lVar6 == 0)) ||
           ((uVar10 < ((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U &&
            (lVar6 = std::__cxx11::string::find((char *)pbVar5,0x48370d,0),
            uVar7 = local_c8.field_0.Context.Line, lVar6 == 0)))) {
          uVar9 = uVar9 + 1;
          std::__cxx11::string::_M_assign((string *)uVar7);
          goto LAB_00163c54;
        }
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x483432,0);
        if (((lVar6 == 0) ||
            (lVar6 = std::__cxx11::string::find((char *)pbVar5,0x483534,0), lVar6 == 0)) ||
           (lVar6 = std::__cxx11::string::find((char *)pbVar5,0x483555,0), lVar6 == 0)) {
          uVar9 = uVar9 + (pbVar5->_M_string_length == 2);
          goto LAB_00163c54;
        }
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x483598,0);
        if ((lVar6 == 0) ||
           (lVar6 = std::__cxx11::string::find((char *)pbVar5,0x4835bf,0), lVar6 == 0)) {
          uVar9 = uVar9 + 1;
          goto LAB_00163c54;
        }
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x4834e6,0);
        if (lVar6 == 0) goto LAB_00163c54;
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x483720,0);
        if (lVar6 == 0) {
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)pbVar5);
          cmsys::SystemTools::CollapseFullPath((string *)local_d8,&local_f8);
          std::__cxx11::string::operator=((string *)&local_f8,(string *)local_d8);
          if ((element_type *)local_d8._0_8_ != &local_c8) {
            operator_delete((void *)local_d8._0_8_,
                            CONCAT71(local_c8.field_0._1_7_,local_c8.field_0._0_1_) + 1);
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_f8);
          std::__cxx11::string::_M_assign((string *)local_c8.field_0._56_8_);
          if ((this->GraphVizFile)._M_string_length == 0) {
            cmSystemTools::Error
                      ("No file specified for --graphviz",(char *)0x0,(char *)0x0,(char *)0x0);
          }
LAB_00163deb:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00163c54;
        }
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x48374d,0);
        if (lVar6 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"debug trycompile on\n",0x14);
          this->DebugTryCompile = true;
          goto LAB_00163c54;
        }
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x483775,0);
        if (lVar6 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Running with debug output on.\n",0x1e);
          this->DebugOutput = true;
          goto LAB_00163c54;
        }
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x4837a3,0);
        if (lVar6 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Running with expanded trace output on.\n",0x27);
          this->Trace = true;
          this->TraceExpand = true;
          goto LAB_00163c54;
        }
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x4837da,0);
        if (lVar6 == 0) {
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)pbVar5);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_f8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_c8.field_0._48_8_,&local_f8);
          this->Trace = true;
          goto LAB_00163deb;
        }
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x4837ea,0);
        if (lVar6 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Running with trace output on.\n",0x1e);
          this->Trace = true;
          this->TraceExpand = false;
          goto LAB_00163c54;
        }
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x483811,0);
        if (lVar6 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warn about uninitialized values.\n",0x21);
          this->WarnUninitialized = true;
          goto LAB_00163c54;
        }
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x483848,0);
        if (lVar6 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Finding unused variables.\n",0x1a);
          this->WarnUnused = true;
          goto LAB_00163c54;
        }
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x483876,0);
        if (lVar6 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Not searching for unused variables given on the ",0x30);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"command line.\n",0xe);
          this->WarnUnusedCli = false;
          goto LAB_00163c54;
        }
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x4838cb,0);
        if (lVar6 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Also check system files when warning about unused and ",
                     0x36);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"uninitialized variables.\n",0x19);
          this->CheckSystemVars = true;
          goto LAB_00163c54;
        }
        lVar6 = std::__cxx11::string::find((char *)pbVar5,0x48394a,0);
        if (lVar6 == 0) {
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)pbVar5);
          if (local_f8._M_string_length == 0) {
            uVar9 = uVar9 + 1;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar9) {
              bVar3 = false;
              cmSystemTools::Error
                        ("No platform specified for -A",(char *)0x0,(char *)0x0,(char *)0x0);
              goto LAB_00163c30;
            }
            std::__cxx11::string::_M_assign((string *)&local_f8);
          }
          if ((local_c8.field_0._24_8_ & 1) == 0) {
            bVar3 = true;
            uVar7 = std::__cxx11::string::_M_assign
                              ((string *)local_c8.field_0.Context.FilePath._M_string_length);
            local_c8.field_0._24_8_ = CONCAT71((int7)((ulong)uVar7 >> 8),1);
          }
          else {
            bVar3 = false;
            cmSystemTools::Error
                      ("Multiple -A options not allowed",(char *)0x0,(char *)0x0,(char *)0x0);
          }
LAB_00163c30:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if (bVar3) goto LAB_00163c54;
        }
        else {
          lVar6 = std::__cxx11::string::find((char *)pbVar5,0x483986,0);
          if (lVar6 == 0) {
            std::__cxx11::string::substr((ulong)&local_f8,(ulong)pbVar5);
            if (local_f8._M_string_length == 0) {
              uVar9 = uVar9 + 1;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar9) {
                bVar3 = false;
                cmSystemTools::Error
                          ("No toolset specified for -T",(char *)0x0,(char *)0x0,(char *)0x0);
                goto LAB_00163c30;
              }
              std::__cxx11::string::_M_assign((string *)&local_f8);
            }
            if ((local_c8.field_0.Bottom.Position.Position & 1) == 0) {
              bVar3 = true;
              uVar7 = std::__cxx11::string::_M_assign
                                ((string *)local_c8.field_0.Context.FilePath._M_dataplus._M_p);
              local_c8.field_0.Bottom.Position.Position = CONCAT71((int7)((ulong)uVar7 >> 8),1);
            }
            else {
              bVar3 = false;
              cmSystemTools::Error
                        ("Multiple -T options not allowed",(char *)0x0,(char *)0x0,(char *)0x0);
            }
            goto LAB_00163c30;
          }
          lVar6 = std::__cxx11::string::find((char *)pbVar5,0x4839c4,0);
          if (lVar6 != 0) {
            SetDirectoriesFromFile(this,(pbVar5->_M_dataplus)._M_p);
            goto LAB_00163c54;
          }
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)pbVar5);
          if (local_f8._M_string_length == 0) {
            uVar9 = uVar9 + 1;
            if ((ulong)uVar9 <
                (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5)) {
              std::__cxx11::string::_M_assign((string *)&local_f8);
              goto LAB_0016403a;
            }
            cmSystemTools::Error
                      ("No generator specified for -G",(char *)0x0,(char *)0x0,(char *)0x0);
            PrintGeneratorList(this);
            bVar3 = false;
          }
          else {
LAB_0016403a:
            gg = CreateGlobalGenerator(this,&local_f8);
            if (gg == (cmGlobalGenerator *)0x0) {
              local_d8._0_8_ = &local_c8;
              local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_c8.field_0._0_1_ = '\0';
              lVar6 = std::__cxx11::string::find((char *)&local_f8,0x4839c7,0);
              if (lVar6 != -1) {
                std::__cxx11::string::operator=
                          ((string *)local_d8,"\nThe KDevelop3 generator is not supported anymore.")
                ;
              }
              std::operator+(&local_70,"Could not create named generator ",&local_f8);
              std::operator+(&local_50,&local_70,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8);
              cmSystemTools::Error(&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              PrintGeneratorList(this);
              if ((element_type *)local_d8._0_8_ != &local_c8) {
                operator_delete((void *)local_d8._0_8_,
                                CONCAT71(local_c8.field_0._1_7_,local_c8.field_0._0_1_) + 1);
              }
              bVar3 = true;
            }
            else {
              bVar3 = true;
              SetGlobalGenerator(this,gg);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if (bVar3) goto LAB_00163c54;
        }
        bVar3 = false;
      }
      if (!bVar3) {
        return;
      }
      uVar10 = (ulong)(uVar9 + 1);
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5)
            );
  }
  psVar8 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  sVar1 = psVar8->_M_string_length;
  psVar8 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  sVar2 = psVar8->_M_string_length;
  collapse = extraout_DL;
  if ((this->CurrentWorkingMode == NORMAL_MODE) && (sVar2 == 0 && sVar1 == 0)) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               "No source or binary directory provided. Both will be assumed to be the same as the current working directory, but note that this warning will become a fatal error in future CMake releases."
               ,"");
    local_d8._0_8_ = (element_type *)0x0;
    local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmMessenger::IssueMessage(this->Messenger,WARNING,&local_f8,(cmListFileBacktrace *)local_d8);
    collapse = extraout_DL_00;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      collapse = extraout_DL_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      collapse = extraout_DL_02;
    }
  }
  if (sVar1 == 0) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_f8,(SystemTools *)0x1,(bool)collapse);
    SetHomeDirectory(this,&local_f8);
    collapse = extraout_DL_03;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      collapse = extraout_DL_04;
    }
  }
  if (sVar2 == 0) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_f8,(SystemTools *)0x1,(bool)collapse);
    SetHomeOutputDirectory(this,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmake::SetArgs(const std::vector<std::string>& args)
{
  bool haveToolset = false;
  bool havePlatform = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-H", 0) == 0 || arg.find("-S", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeDirectory(path);
    } else if (arg.find("-O", 0) == 0) {
      // There is no local generate anymore.  Ignore -O option.
    } else if (arg.find("-B", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeOutputDirectory(path);
    } else if ((i < args.size() - 2) &&
               (arg.find("--check-build-system", 0) == 0)) {
      this->CheckBuildSystemArgument = args[++i];
      this->ClearBuildSystem = (atoi(args[++i].c_str()) > 0);
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-file", 0) == 0)) {
      this->CheckStampFile = args[++i];
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-list", 0) == 0)) {
      this->CheckStampList = args[++i];
    }
#if defined(CMAKE_HAVE_VS_GENERATORS)
    else if ((i < args.size() - 1) &&
             (arg.find("--vs-solution-file", 0) == 0)) {
      this->VSSolutionFile = args[++i];
    }
#endif
    else if (arg.find("-D", 0) == 0) {
      // skip for now
      // in case '-D var=val' is given, also skip the next
      // in case '-Dvar=val' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-U", 0) == 0) {
      // skip for now
      // in case '-U var' is given, also skip the next
      // in case '-Uvar' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-C", 0) == 0) {
      // skip for now
      // in case '-C path' is given, also skip the next
      // in case '-Cpath' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-P", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("--find-package", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("-W", 0) == 0) {
      // skip for now
    } else if (arg.find("--graphviz=", 0) == 0) {
      std::string path = arg.substr(strlen("--graphviz="));
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->GraphVizFile = path;
      if (this->GraphVizFile.empty()) {
        cmSystemTools::Error("No file specified for --graphviz");
      }
    } else if (arg.find("--debug-trycompile", 0) == 0) {
      std::cout << "debug trycompile on\n";
      this->DebugTryCompileOn();
    } else if (arg.find("--debug-output", 0) == 0) {
      std::cout << "Running with debug output on.\n";
      this->SetDebugOutputOn(true);
    } else if (arg.find("--trace-expand", 0) == 0) {
      std::cout << "Running with expanded trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(true);
    } else if (arg.find("--trace-source=", 0) == 0) {
      std::string file = arg.substr(strlen("--trace-source="));
      cmSystemTools::ConvertToUnixSlashes(file);
      this->AddTraceSource(file);
      this->SetTrace(true);
    } else if (arg.find("--trace", 0) == 0) {
      std::cout << "Running with trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(false);
    } else if (arg.find("--warn-uninitialized", 0) == 0) {
      std::cout << "Warn about uninitialized values.\n";
      this->SetWarnUninitialized(true);
    } else if (arg.find("--warn-unused-vars", 0) == 0) {
      std::cout << "Finding unused variables.\n";
      this->SetWarnUnused(true);
    } else if (arg.find("--no-warn-unused-cli", 0) == 0) {
      std::cout << "Not searching for unused variables given on the "
                << "command line.\n";
      this->SetWarnUnusedCli(false);
    } else if (arg.find("--check-system-vars", 0) == 0) {
      std::cout << "Also check system files when warning about unused and "
                << "uninitialized variables.\n";
      this->SetCheckSystemVars(true);
    } else if (arg.find("-A", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No platform specified for -A");
          return;
        }
        value = args[i];
      }
      if (havePlatform) {
        cmSystemTools::Error("Multiple -A options not allowed");
        return;
      }
      this->GeneratorPlatform = value;
      havePlatform = true;
    } else if (arg.find("-T", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No toolset specified for -T");
          return;
        }
        value = args[i];
      }
      if (haveToolset) {
        cmSystemTools::Error("Multiple -T options not allowed");
        return;
      }
      this->GeneratorToolset = value;
      haveToolset = true;
    } else if (arg.find("-G", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return;
        }
        value = args[i];
      }
      cmGlobalGenerator* gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        std::string kdevError;
        if (value.find("KDevelop3", 0) != std::string::npos) {
          kdevError = "\nThe KDevelop3 generator is not supported anymore.";
        }

        cmSystemTools::Error("Could not create named generator " + value +
                             kdevError);
        this->PrintGeneratorList();
      } else {
        this->SetGlobalGenerator(gen);
      }
    }
    // no option assume it is the path to the source or an existing build
    else {
      this->SetDirectoriesFromFile(arg.c_str());
    }
  }